

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O1

int CreateMushroomFunc(VMFunctionBuilder *buildit,int value1,int value2)

{
  uint uVar1;
  int iVar2;
  
  VMFunctionBuilder::Emit(buildit,0x46,0,0x80,0);
  VMFunctionBuilder::Emit(buildit,0x46,0,0x80,0);
  VMFunctionBuilder::Emit(buildit,0x47,1);
  if (value1 == 0) {
    iVar2 = 0x80;
    uVar1 = 0;
  }
  else {
    uVar1 = VMFunctionBuilder::GetConstantFloat(buildit,(double)value1 * 1.52587890625e-05);
    iVar2 = 5;
  }
  VMFunctionBuilder::Emit(buildit,0x46,0,iVar2,uVar1);
  if (value2 == 0) {
    iVar2 = 0x80;
    uVar1 = 0;
  }
  else {
    uVar1 = VMFunctionBuilder::GetConstantFloat(buildit,(double)value2 * 1.52587890625e-05);
    iVar2 = 5;
  }
  VMFunctionBuilder::Emit(buildit,0x46,0,iVar2,uVar1);
  return 5;
}

Assistant:

static int CreateMushroomFunc(VMFunctionBuilder &buildit, int value1, int value2)
{ // A_Mushroom
	buildit.Emit(OP_PARAM, 0, REGT_NIL, 0);		// spawntype
	buildit.Emit(OP_PARAM, 0, REGT_NIL, 0);		// numspawns
	buildit.Emit(OP_PARAMI, 1);					// flag
	// vrange
	if (value1 == 0)
	{
		buildit.Emit(OP_PARAM, 0, REGT_NIL, 0);
	}
	else
	{
		buildit.Emit(OP_PARAM, 0, REGT_FLOAT | REGT_KONST, buildit.GetConstantFloat(DEHToDouble(value1)));
	}
	// hrange
	if (value2 == 0)
	{
		buildit.Emit(OP_PARAM, 0, REGT_NIL, 0);
	}
	else
	{
		buildit.Emit(OP_PARAM, 0, REGT_FLOAT | REGT_KONST, buildit.GetConstantFloat(DEHToDouble(value2)));
	}
	return 5;
}